

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateStaticVariableInitializers
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Descriptor *pDVar4;
  MessageGenerator local_48;
  int local_1c;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  for (local_1c = 0; iVar1 = local_1c, iVar3 = Descriptor::nested_type_count(this->descriptor_),
      iVar1 < iVar3; local_1c = local_1c + 1) {
    pDVar4 = Descriptor::nested_type(this->descriptor_,local_1c);
    bVar2 = IsMapEntry(pDVar4);
    if (!bVar2) {
      pDVar4 = Descriptor::nested_type(this->descriptor_,local_1c);
      MessageGenerator(&local_48,pDVar4,this->params_);
      GenerateStaticVariableInitializers(&local_48,pPStack_18);
      ~MessageGenerator(&local_48);
    }
  }
  return;
}

Assistant:

void MessageGenerator::GenerateStaticVariableInitializers(
    io::Printer* printer) {
  // Generate static member initializers for all nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
   // TODO(kenton):  Reuse MessageGenerator objects?
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    MessageGenerator(descriptor_->nested_type(i), params_)
      .GenerateStaticVariableInitializers(printer);
  }
}